

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O0

QByteArray * __thiscall QByteArray::assign(QByteArray *this,QByteArrayView v)

{
  bool bVar1;
  size_t __n;
  qsizetype qVar2;
  char *pcVar3;
  const_pointer __src;
  QArrayDataPointer<char> *in_RDI;
  long in_FS_OFFSET;
  qsizetype offset;
  qsizetype len;
  QByteArray *in_stack_ffffffffffffff98;
  QByteArrayView *in_stack_ffffffffffffffa0;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __n = QByteArrayView::size(&local_18);
  qVar2 = capacity((QByteArray *)0x144e62);
  if ((qVar2 < (long)__n) || (bVar1 = isDetached((QByteArray *)0x144e7d), !bVar1)) {
    QByteArrayView::toByteArray(in_stack_ffffffffffffffa0);
    operator=((QByteArray *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    ~QByteArray((QByteArray *)0x144f33);
  }
  else {
    qVar2 = QArrayDataPointer<char>::freeSpaceAtBegin(in_RDI);
    if (qVar2 != 0) {
      pcVar3 = QArrayDataPointer<char>::begin((QArrayDataPointer<char> *)0x144ea7);
      QArrayDataPointer<char>::setBegin(in_RDI,pcVar3 + -qVar2);
    }
    pcVar3 = QArrayDataPointer<char>::begin((QArrayDataPointer<char> *)0x144ec8);
    __src = QByteArrayView::data(&local_18);
    memcpy(pcVar3,__src,__n);
    in_RDI->size = __n;
    pcVar3 = QArrayDataPointer<char>::data(in_RDI);
    pcVar3[in_RDI->size] = '\0';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QByteArray *)in_RDI;
}

Assistant:

QByteArray &QByteArray::assign(QByteArrayView v)
{
    const auto len = v.size();

    if (len <= capacity() &&  isDetached()) {
        const auto offset = d.freeSpaceAtBegin();
        if (offset)
            d.setBegin(d.begin() - offset);
        std::memcpy(d.begin(), v.data(), len);
        d.size = len;
        d.data()[d.size] = '\0';
    } else {
        *this = v.toByteArray();
    }
    return *this;
}